

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O2

QRect __thiscall
QMdiAreaPrivate::resizeToMinimumTileSize
          (QMdiAreaPrivate *this,QSize *minSubWindowSize,int subWindowCount)

{
  uint uVar1;
  QWidget *this_00;
  QWidgetData *pQVar2;
  QRect QVar3;
  QRect QVar4;
  int iVar5;
  QStyle *pQVar6;
  QSize QVar7;
  QSize QVar8;
  QSize QVar9;
  ulong uVar10;
  ulong uVar11;
  Representation RVar13;
  Representation RVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  QWidget *this_01;
  bool bVar20;
  double dVar21;
  QRect QVar22;
  QRect QVar23;
  ulong uVar12;
  
  if (((subWindowCount < 1) || (iVar19 = (minSubWindowSize->wd).m_i, iVar19 < 0)) ||
     (iVar17 = (minSubWindowSize->ht).m_i, iVar17 < 0)) {
    QVar22 = QWidget::rect((this->super_QAbstractScrollAreaPrivate).viewport);
    uVar16 = QVar22._0_8_ >> 0x20;
    uVar11 = QVar22._8_8_ >> 0x20;
  }
  else {
    this_00 = *(QWidget **)
               &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
                field_0x8;
    dVar21 = ceil(SQRT((double)subWindowCount));
    uVar11 = 1;
    if (1 < (int)dVar21) {
      uVar11 = (ulong)(uint)(int)dVar21;
    }
    bVar20 = (int)((ulong)(uint)subWindowCount % uVar11) != 0;
    iVar15 = (int)((uint)subWindowCount / uVar11);
    iVar19 = iVar19 * (int)uVar11;
    iVar17 = iVar17 * (iVar15 + (uint)bVar20 + (uint)(iVar15 + (uint)bVar20 == 0));
    this_01 = this_00;
    if (this->tileCalledFromResizeEvent == false) {
      while (((this_01 != (QWidget *)0x0 &&
              (uVar1 = (this_01->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                       super_QFlagsStorage<Qt::WindowType>.i, (uVar1 & 1) == 0)) &&
             ((uVar1 & 0xff) != 0x12))) {
        this_01 = *(QWidget **)(*(long *)&this_01->field_0x8 + 0x10);
      }
      iVar15 = (this->super_QAbstractScrollAreaPrivate).bottom +
               (this->super_QAbstractScrollAreaPrivate).top + iVar17 + 2;
      pQVar2 = (((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider).
               super_QWidget.data;
      if ((pQVar2->widget_attributes & 0x8000) != 0) {
        iVar15 = ((iVar15 + (pQVar2->crect).y2.m_i) - (pQVar2->crect).y1.m_i) + 1;
      }
      iVar18 = (this->super_QAbstractScrollAreaPrivate).right +
               (this->super_QAbstractScrollAreaPrivate).left + iVar19 + 2;
      pQVar2 = (((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider).
               super_QWidget.data;
      if ((pQVar2->widget_attributes & 0x8000) != 0) {
        iVar18 = ((iVar18 + (pQVar2->crect).x2.m_i) - (pQVar2->crect).x1.m_i) + 1;
      }
      pQVar6 = QWidget::style(this_00);
      iVar5 = (**(code **)(*(long *)pQVar6 + 0xf0))(pQVar6,0x11,0,this_00,0);
      if (iVar5 != 0) {
        pQVar6 = QWidget::style(this_00);
        iVar5 = (**(code **)(*(long *)pQVar6 + 0xe0))(pQVar6,5,0,this_00);
        iVar18 = iVar18 + iVar5 * 2;
        iVar15 = iVar15 + iVar5 * 2;
      }
      QVar7 = QWidget::size(this_00);
      RVar14.m_i = QVar7.ht.m_i.m_i;
      if (QVar7.ht.m_i.m_i < iVar15) {
        RVar14.m_i = iVar15;
      }
      QVar8 = QWidget::size(this_00);
      if ((this->super_QAbstractScrollAreaPrivate).hbarpolicy == ScrollBarAlwaysOff) {
        RVar13.m_i = QVar7.wd.m_i.m_i;
        if (QVar7.wd.m_i.m_i < iVar18) {
          RVar13.m_i = iVar18;
        }
        QVar7 = QWidget::size(this_01);
        QVar9 = QWidget::size(this_01);
        QWidget::resize(this_01,(RVar13.m_i - QVar8.wd.m_i) + QVar7.wd.m_i.m_i,QVar9.ht.m_i.m_i);
      }
      if ((this->super_QAbstractScrollAreaPrivate).vbarpolicy == ScrollBarAlwaysOff) {
        QVar7 = QWidget::size(this_01);
        QVar9 = QWidget::size(this_01);
        QWidget::resize(this_01,QVar7.wd.m_i.m_i,(RVar14.m_i - QVar8.ht.m_i) + QVar9.ht.m_i.m_i);
      }
    }
    QVar23 = QWidget::rect((this->super_QAbstractScrollAreaPrivate).viewport);
    uVar12 = QVar23._8_8_;
    uVar10 = QVar23._0_8_;
    uVar16 = uVar10 >> 0x20;
    uVar11 = uVar12 >> 0x20;
    if ((QVar23.x2.m_i.m_i - QVar23.x1.m_i) + 1 < iVar19) {
      uVar12 = (ulong)((iVar19 + QVar23.x1.m_i.m_i) - 1);
      if ((this->super_QAbstractScrollAreaPrivate).hbarpolicy == ScrollBarAlwaysOff) {
        QAbstractScrollArea::setHorizontalScrollBarPolicy
                  ((QAbstractScrollArea *)this_00,ScrollBarAsNeeded);
      }
      else {
        QAbstractSlider::setValue
                  (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider,0);
      }
    }
    QVar4.x2.m_i = (int)uVar12;
    QVar4.y2.m_i = (int)(uVar12 >> 0x20);
    QVar4.x1.m_i = (int)uVar10;
    QVar4.y1.m_i = (int)(uVar10 >> 0x20);
    QVar3.x2.m_i = (int)uVar12;
    QVar3.y2.m_i = (int)(uVar12 >> 0x20);
    QVar3.x1.m_i = (int)uVar10;
    QVar3.y1.m_i = (int)(uVar10 >> 0x20);
    QVar22.x2.m_i = (int)uVar12;
    QVar22.y2.m_i = (int)(uVar12 >> 0x20);
    QVar22.x1.m_i = (int)uVar10;
    QVar22.y1.m_i = (int)(uVar10 >> 0x20);
    if ((QVar23.y2.m_i.m_i - QVar23.y1.m_i) + 1 < iVar17) {
      uVar11 = (ulong)((iVar17 + QVar23.y1.m_i.m_i) - 1);
      if ((this->super_QAbstractScrollAreaPrivate).vbarpolicy == ScrollBarAlwaysOff) {
        QAbstractScrollArea::setVerticalScrollBarPolicy
                  ((QAbstractScrollArea *)this_00,ScrollBarAsNeeded);
        QVar22 = QVar3;
      }
      else {
        QAbstractSlider::setValue
                  (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,0);
        QVar22 = QVar4;
      }
    }
  }
  QVar23._0_8_ = QVar22._0_8_ & 0xffffffff | uVar16 << 0x20;
  QVar23._8_8_ = QVar22._8_8_ & 0xffffffff | uVar11 << 0x20;
  return QVar23;
}

Assistant:

QRect QMdiAreaPrivate::resizeToMinimumTileSize(const QSize &minSubWindowSize, int subWindowCount)
{
    Q_Q(QMdiArea);
    if (!minSubWindowSize.isValid() || subWindowCount <= 0)
        return viewport->rect();

    // Calculate minimum size.
    const int columns = qMax(qCeil(qSqrt(qreal(subWindowCount))), 1);
    const int rows = qMax((subWindowCount % columns) ? (subWindowCount / columns + 1)
                                                     : (subWindowCount / columns), 1);
    const int minWidth = minSubWindowSize.width() * columns;
    const int minHeight = minSubWindowSize.height() * rows;

    // Increase area size if necessary. Scroll bars are provided if we're not able
    // to resize to the minimum size.
    if (!tileCalledFromResizeEvent) {
        QWidget *topLevel = q;
        // Find the topLevel for this area, either a real top-level or a sub-window.
        while (topLevel && !topLevel->isWindow() && topLevel->windowType() != Qt::SubWindow)
            topLevel = topLevel->parentWidget();
        // We don't want sub-subwindows to be placed at the edge, thus add 2 pixels.
        int minAreaWidth = minWidth + left + right + 2;
        int minAreaHeight = minHeight + top + bottom + 2;
        if (hbar->isVisible())
            minAreaHeight += hbar->height();
        if (vbar->isVisible())
            minAreaWidth += vbar->width();
        if (q->style()->styleHint(QStyle::SH_ScrollView_FrameOnlyAroundContents, nullptr, q)) {
            const int frame = q->style()->pixelMetric(QStyle::PM_DefaultFrameWidth, nullptr, q);
            minAreaWidth += 2 * frame;
            minAreaHeight += 2 * frame;
        }
        const QSize diff = QSize(minAreaWidth, minAreaHeight).expandedTo(q->size()) - q->size();
        // Only resize topLevel widget if scroll bars are disabled.
        if (hbarpolicy == Qt::ScrollBarAlwaysOff)
            topLevel->resize(topLevel->size().width() + diff.width(), topLevel->size().height());
        if (vbarpolicy == Qt::ScrollBarAlwaysOff)
            topLevel->resize(topLevel->size().width(), topLevel->size().height() + diff.height());
    }

    QRect domain = viewport->rect();

    // Adjust domain width and provide horizontal scroll bar.
    if (domain.width() < minWidth) {
        domain.setWidth(minWidth);
        if (hbarpolicy == Qt::ScrollBarAlwaysOff)
            q->setHorizontalScrollBarPolicy(Qt::ScrollBarAsNeeded);
        else
            hbar->setValue(0);
    }
    // Adjust domain height and provide vertical scroll bar.
    if (domain.height() < minHeight) {
        domain.setHeight(minHeight);
        if (vbarpolicy  == Qt::ScrollBarAlwaysOff)
            q->setVerticalScrollBarPolicy(Qt::ScrollBarAsNeeded);
        else
            vbar->setValue(0);
    }
    return domain;
}